

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-app.cpp
# Opt level: O2

void __thiscall
StateRecording::updateWorker(StateRecording *this,string *dataOutput,float tElapsed_s)

{
  mutex *__mutex;
  TWaveformF *this_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  pointer psVar7;
  ulong uVar8;
  TKeyPressPosition *pTVar9;
  pointer psVar10;
  ulong uVar11;
  float fVar12;
  undefined4 uVar13;
  TWaveformF waveformFFiltered;
  TWaveformI16 waveformThreshold;
  TWaveformI16 waveformMax;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __mutex = &this->mutex;
  std::mutex::lock(__mutex);
  this_00 = &this->waveformFWork;
  std::vector<float,_std::allocator<float>_>::operator=(this_00,&this->waveformF);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  fVar12 = 100.0;
  if ((tElapsed_s < 0.0) && (this->freqCutoff_Hz == 0)) {
    lVar3 = std::chrono::_V2::system_clock::now();
    fVar12 = Cipher::findBestCutoffFreq(this_00,FirstOrderHighPass,16000,100.0,1000.0,100.0);
    lVar4 = std::chrono::_V2::system_clock::now();
    printf("[+] Found best freqCutoff = %d Hz, took %4.3f seconds\n",
           SUB84((double)((float)((lVar4 - lVar3) / 1000000) / 1000.0),0),(ulong)(uint)(int)fVar12,
           (lVar4 - lVar3) % 1000000);
    fVar12 = (float)(int)fVar12;
  }
  std::vector<float,_std::allocator<float>_>::vector(&waveformFFiltered,this_00);
  filter<float>(&waveformFFiltered,FirstOrderHighPass,fVar12,16000);
  bVar1 = convert<float,short>(&waveformFFiltered,&this->waveformI16);
  if (!bVar1) {
    puts("Conversion failed");
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&waveformFFiltered.super__Vector_base<float,_std::allocator<float>_>);
  waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  waveformMax.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  waveformThreshold.super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  waveformFFiltered.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->waveformI16).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start;
  waveformFFiltered.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)(this->waveformI16).super__Vector_base<short,_std::allocator<short>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)waveformFFiltered.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 1);
  bVar1 = findKeyPresses<short>
                    ((TWaveformViewT<short> *)&waveformFFiltered,&this->keyPresses,
                     &waveformThreshold,&waveformMax,8.0,0x200,0x800,true);
  if (!bVar1) {
    puts("Failed to detect keypresses");
  }
  std::mutex::lock(__mutex);
  psVar10 = (this->keyPresses).
            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->keyPresses).
           super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar7 - (long)psVar10;
  if (lVar3 == 0) {
    uVar13 = 0;
    psVar10 = psVar7;
  }
  else {
    uVar5 = lVar3 / 0x30;
    uVar6 = (long)(this->waveformF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->waveformF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar11 = 0;
    uVar8 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar8 = uVar11;
    }
    pTVar9 = &psVar10->pos;
    for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      if ((long)(int)(uVar6 >> 2) + -160000 <= *pTVar9) {
        uVar8 = uVar11 & 0xffffffff;
        break;
      }
      pTVar9 = pTVar9 + 6;
    }
    iVar2 = this->nKeysHave;
    std::__cxx11::to_string(&local_90,iVar2);
    std::operator+(&local_70,"recording ",&local_90);
    std::operator+(&local_50,&local_70," ");
    fVar12 = (float)(ulong)((long)uVar6 >> 2) / 16000.0;
    if (10.0 <= fVar12) {
      fVar12 = 10.0;
    }
    fVar12 = ((float)(iVar2 - (int)uVar8) * 60.0) / fVar12;
    std::__cxx11::to_string(&local_b0,fVar12);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &waveformFFiltered,&local_50,&local_b0);
    std::__cxx11::string::operator=((string *)dataOutput,(string *)&waveformFFiltered);
    std::__cxx11::string::~string((string *)&waveformFFiltered);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    uVar13 = SUB84((double)fVar12,0);
    psVar7 = (this->keyPresses).
             super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    psVar10 = (this->keyPresses).
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  uVar8 = ((long)psVar7 - (long)psVar10) / 0x30;
  iVar2 = (int)uVar8;
  if (this->nKeysHave < iVar2) {
    this->nKeysHave = iVar2;
    printf("    Detected %d keys. %d left. Average typing speed: %5.2f cpm\n",uVar13,
           uVar8 & 0xffffffff,(ulong)(uint)(this->nKeysToCapture - iVar2));
  }
  if (120.0 < tElapsed_s) {
    puts("[!] Recording limit reached");
    LOCK();
    (this->doneRecording)._M_base._M_i = true;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&waveformThreshold.super__Vector_base<short,_std::allocator<short>_>);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&waveformMax.super__Vector_base<short,_std::allocator<short>_>);
  return;
}

Assistant:

void updateWorker(std::string & dataOutput, float tElapsed_s) {
        {
            std::lock_guard lock(mutex);
            waveformFWork = waveformF;
        }
        {
            auto freqCutoffCur_Hz = freqCutoff_Hz;

            if (tElapsed_s < 0.0f && freqCutoffCur_Hz == 0) {
                const auto tStart = std::chrono::high_resolution_clock::now();

                freqCutoffCur_Hz = Cipher::findBestCutoffFreq(waveformFWork, EAudioFilter::FirstOrderHighPass, kSampleRate, 100.0f, 1000.0f, 100.0f);

                const auto tEnd = std::chrono::high_resolution_clock::now();
                printf("[+] Found best freqCutoff = %d Hz, took %4.3f seconds\n", freqCutoffCur_Hz, toSeconds(tStart, tEnd));
            } else {
                freqCutoffCur_Hz = kFreqCutoff_Hz;
            }

            // apply default filtering, because keypress detection without it is impossible
            auto waveformFFiltered = waveformFWork;
            ::filter(waveformFFiltered, EAudioFilter::FirstOrderHighPass, freqCutoffCur_Hz, kSampleRate);

            if (convert(waveformFFiltered, waveformI16) == false) {
                printf("Conversion failed\n");
            }
        }

        TWaveformI16 waveformMax;
        TWaveformI16 waveformThreshold;
        if (findKeyPresses(getView(waveformI16, 0), keyPresses, waveformThreshold, waveformMax,
                           kFindKeysThreshold, kFindKeysHistorySize, kFindKeysHistorySizeReset, kFindKeysRemoveLowPower) == false) {
            printf("Failed to detect keypresses\n");
        }

        {
            std::lock_guard lock(mutex);

            float cpm = 0.0f;
            if (keyPresses.size() > 0) {
                int idx = 0;
                while (idx < (int) keyPresses.size() && keyPresses[idx].pos < ((int) waveformF.size() - 10*kSampleRate)) {
                    ++idx;
                }
                cpm = 60.0f*(nKeysHave - idx)/std::min(10.0f, (float) waveformF.size()/kSampleRate);
                dataOutput = "recording " + std::to_string(nKeysHave) + " " + std::to_string(cpm);
            }

            if (nKeysHave < (int) keyPresses.size()) {
                nKeysHave = keyPresses.size();

                printf("    Detected %d keys. %d left. Average typing speed: %5.2f cpm\n", nKeysHave, nKeysToCapture - nKeysHave, cpm);
            }

            if (tElapsed_s > 2*60.0f) {
                printf("[!] Recording limit reached\n");
                doneRecording = true;
            }
        }
    }